

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScalePlaneSimple_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int *unaff_retaddr;
  long in_stack_00000008;
  long in_stack_00000010;
  int dy;
  int dx;
  int y;
  int x;
  _func_void_uint16_t_ptr_uint16_t_ptr_int_int_int *ScaleCols;
  int i;
  int iVar2;
  undefined4 uVar3;
  int local_30;
  int iVar4;
  code *pcVar5;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  pcVar5 = ScaleCols_16_C;
  iVar4 = 0;
  local_30 = 0;
  uVar3 = 0;
  iVar2 = 0;
  ScaleSlope(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,0,0x169d80,kFilterNone,(int *)0x0,
             (int *)CONCAT44(in_EDX,in_ECX),(int *)CONCAT44(in_EDI,in_ESI),unaff_retaddr);
  iVar1 = Abs(in_EDI);
  if ((iVar1 << 1 == in_EDX) && (iVar4 < 0x8000)) {
    pcVar5 = ScaleColsUp2_16_C;
  }
  for (iVar1 = 0; iVar1 < in_ECX; iVar1 = iVar1 + 1) {
    (*pcVar5)(in_stack_00000010,in_stack_00000008 + (long)((local_30 >> 0x10) * in_R8D) * 2,in_EDX,
              iVar4,uVar3);
    in_stack_00000010 = in_stack_00000010 + (long)in_R9D * 2;
    local_30 = iVar2 + local_30;
  }
  return;
}

Assistant:

static void ScalePlaneSimple_16(int src_width,
                                int src_height,
                                int dst_width,
                                int dst_height,
                                int src_stride,
                                int dst_stride,
                                const uint16_t* src_ptr,
                                uint16_t* dst_ptr) {
  int i;
  void (*ScaleCols)(uint16_t * dst_ptr, const uint16_t* src_ptr, int dst_width,
                    int x, int dx) = ScaleCols_16_C;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  ScaleSlope(src_width, src_height, dst_width, dst_height, kFilterNone, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

  if (src_width * 2 == dst_width && x < 0x8000) {
    ScaleCols = ScaleColsUp2_16_C;
#if defined(HAS_SCALECOLS_16_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleCols = ScaleColsUp2_16_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_16_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleCols = ScaleColsUp2_16_MMI;
    }
#endif
  }

  for (i = 0; i < dst_height; ++i) {
    ScaleCols(dst_ptr, src_ptr + (y >> 16) * src_stride, dst_width, x, dx);
    dst_ptr += dst_stride;
    y += dy;
  }
}